

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O2

size_t ZSTD_decompressContinue
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  blockType_e bVar1;
  unsigned_long_long uVar2;
  ZSTD_dStage ZVar3;
  size_t sVar4;
  XXH64_hash_t XVar5;
  U64 compressedSize;
  size_t err_code;
  blockProperties_t bp;
  
  sVar4 = ZSTD_nextSrcSizeToDecompressWithInputSize(dctx,srcSize);
  if (sVar4 != srcSize) {
    return 0xffffffffffffffb8;
  }
  ZSTD_checkContinuity(dctx,dst,dstCapacity);
  compressedSize = dctx->processedCSize + srcSize;
  dctx->processedCSize = compressedSize;
  switch(dctx->stage) {
  case ZSTDds_getFrameHeaderSize:
    if ((dctx->format == ZSTD_f_zstd1) && ((*src & 0xfffffff0) == 0x184d2a50)) {
      memcpy(dctx->headerBuffer,src,srcSize);
      dctx->expected = 8 - srcSize;
      dctx->stage = ZSTDds_decodeSkippableHeader;
    }
    else {
      sVar4 = ZSTD_frameHeaderSize_internal(src,srcSize,dctx->format);
      dctx->headerSize = sVar4;
      if (0xffffffffffffff88 < sVar4) {
        return sVar4;
      }
      memcpy(dctx->headerBuffer,src,srcSize);
      dctx->expected = sVar4 - srcSize;
      dctx->stage = ZSTDds_decodeFrameHeader;
    }
    break;
  case ZSTDds_decodeFrameHeader:
    memcpy((void *)((long)dctx + (dctx->headerSize - srcSize) + 0x276b0),src,srcSize);
    sVar4 = ZSTD_decodeFrameHeader(dctx,dctx->headerBuffer,dctx->headerSize);
    if (0xffffffffffffff88 < sVar4) {
      return sVar4;
    }
    dctx->expected = 3;
    dctx->stage = ZSTDds_decodeBlockHeader;
    break;
  case ZSTDds_decodeBlockHeader:
    sVar4 = ZSTD_getcBlockSize(src,3,&bp);
    if (0xffffffffffffff88 < sVar4) {
      return sVar4;
    }
    if ((dctx->fParams).blockSizeMax < sVar4) {
      return 0xffffffffffffffec;
    }
    dctx->expected = sVar4;
    dctx->bType = bp.blockType;
    dctx->rleSize = (ulong)bp.origSize;
    if (sVar4 == 0) {
      if (bp.lastBlock == 0) {
        dctx->expected = 3;
        ZVar3 = ZSTDds_decodeBlockHeader;
      }
      else if ((dctx->fParams).checksumFlag == 0) {
        dctx->expected = 0;
        ZVar3 = ZSTDds_getFrameHeaderSize;
      }
      else {
        dctx->expected = 4;
        ZVar3 = ZSTDds_checkChecksum;
      }
    }
    else {
      ZVar3 = ZSTDds_decompressLastBlock - (bp.lastBlock == 0);
    }
    dctx->stage = ZVar3;
    break;
  case ZSTDds_decompressBlock:
  case ZSTDds_decompressLastBlock:
    bVar1 = dctx->bType;
    if (bVar1 == bt_raw) {
      if (dstCapacity < srcSize) {
        return 0xffffffffffffffba;
      }
      if (dst == (void *)0x0) {
        if (srcSize != 0) {
          return 0xffffffffffffffb6;
        }
      }
      else {
        memcpy(dst,src,srcSize);
        if (0xffffffffffffff88 < srcSize) {
          return srcSize;
        }
      }
      sVar4 = dctx->expected - srcSize;
      dctx->expected = sVar4;
    }
    else {
      if (bVar1 == bt_rle) {
        srcSize = dctx->rleSize;
        if (dstCapacity < srcSize) {
          srcSize = 0xffffffffffffffba;
        }
        else if (dst == (void *)0x0) {
          if (srcSize != 0) {
            srcSize = 0xffffffffffffffb6;
          }
        }
        else {
          memset(dst,(uint)*src,srcSize);
        }
      }
      else {
        if (bVar1 != bt_compressed) {
          return 0xffffffffffffffec;
        }
        srcSize = ZSTD_decompressBlock_internal(dctx,dst,dstCapacity,src,srcSize,1);
      }
      dctx->expected = 0;
      if (0xffffffffffffff88 < srcSize) {
        return srcSize;
      }
      sVar4 = 0;
    }
    if ((dctx->fParams).blockSizeMax < srcSize) {
      return 0xffffffffffffffec;
    }
    dctx->decodedSize = dctx->decodedSize + srcSize;
    if (dctx->validateChecksum != 0) {
      XXH64_update(&dctx->xxhState,dst,srcSize);
      sVar4 = dctx->expected;
    }
    dctx->previousDstEnd = (void *)((long)dst + srcSize);
    if (sVar4 != 0) {
      return srcSize;
    }
    if (dctx->stage != ZSTDds_decompressLastBlock) {
      dctx->stage = ZSTDds_decodeBlockHeader;
      dctx->expected = 3;
      return srcSize;
    }
    uVar2 = (dctx->fParams).frameContentSize;
    if ((uVar2 != 0xffffffffffffffff) && (dctx->decodedSize != uVar2)) {
      return 0xffffffffffffffec;
    }
    if ((dctx->fParams).checksumFlag != 0) {
      dctx->expected = 4;
      dctx->stage = ZSTDds_checkChecksum;
      return srcSize;
    }
    ZSTD_DCtx_trace_end(dctx,dctx->decodedSize,dctx->processedCSize,1);
    dctx->expected = 0;
    dctx->stage = ZSTDds_getFrameHeaderSize;
    return srcSize;
  case ZSTDds_checkChecksum:
    if (dctx->validateChecksum != 0) {
      XVar5 = XXH64_digest(&dctx->xxhState);
      if (*src != (int)XVar5) {
        return 0xffffffffffffffea;
      }
      compressedSize = dctx->processedCSize;
    }
    ZSTD_DCtx_trace_end(dctx,dctx->decodedSize,compressedSize,1);
  case ZSTDds_skipFrame:
    dctx->expected = 0;
    dctx->stage = ZSTDds_getFrameHeaderSize;
    break;
  case ZSTDds_decodeSkippableHeader:
    memcpy((void *)((long)dctx + (0x276b8 - srcSize)),src,srcSize);
    dctx->expected = (ulong)*(uint *)(dctx->headerBuffer + 4);
    dctx->stage = ZSTDds_skipFrame;
    break;
  default:
    return 0xffffffffffffffff;
  }
  return 0;
}

Assistant:

size_t ZSTD_decompressContinue(ZSTD_DCtx* dctx, void* dst, size_t dstCapacity, const void* src, size_t srcSize)
{
    DEBUGLOG(5, "ZSTD_decompressContinue (srcSize:%u)", (unsigned)srcSize);
    /* Sanity check */
    RETURN_ERROR_IF(srcSize != ZSTD_nextSrcSizeToDecompressWithInputSize(dctx, srcSize), srcSize_wrong, "not allowed");
    ZSTD_checkContinuity(dctx, dst, dstCapacity);

    dctx->processedCSize += srcSize;

    switch (dctx->stage)
    {
    case ZSTDds_getFrameHeaderSize :
        assert(src != NULL);
        if (dctx->format == ZSTD_f_zstd1) {  /* allows header */
            assert(srcSize >= ZSTD_FRAMEIDSIZE);  /* to read skippable magic number */
            if ((MEM_readLE32(src) & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {        /* skippable frame */
                ZSTD_memcpy(dctx->headerBuffer, src, srcSize);
                dctx->expected = ZSTD_SKIPPABLEHEADERSIZE - srcSize;  /* remaining to load to get full skippable frame header */
                dctx->stage = ZSTDds_decodeSkippableHeader;
                return 0;
        }   }
        dctx->headerSize = ZSTD_frameHeaderSize_internal(src, srcSize, dctx->format);
        if (ZSTD_isError(dctx->headerSize)) return dctx->headerSize;
        ZSTD_memcpy(dctx->headerBuffer, src, srcSize);
        dctx->expected = dctx->headerSize - srcSize;
        dctx->stage = ZSTDds_decodeFrameHeader;
        return 0;

    case ZSTDds_decodeFrameHeader:
        assert(src != NULL);
        ZSTD_memcpy(dctx->headerBuffer + (dctx->headerSize - srcSize), src, srcSize);
        FORWARD_IF_ERROR(ZSTD_decodeFrameHeader(dctx, dctx->headerBuffer, dctx->headerSize), "");
        dctx->expected = ZSTD_blockHeaderSize;
        dctx->stage = ZSTDds_decodeBlockHeader;
        return 0;

    case ZSTDds_decodeBlockHeader:
        {   blockProperties_t bp;
            size_t const cBlockSize = ZSTD_getcBlockSize(src, ZSTD_blockHeaderSize, &bp);
            if (ZSTD_isError(cBlockSize)) return cBlockSize;
            RETURN_ERROR_IF(cBlockSize > dctx->fParams.blockSizeMax, corruption_detected, "Block Size Exceeds Maximum");
            dctx->expected = cBlockSize;
            dctx->bType = bp.blockType;
            dctx->rleSize = bp.origSize;
            if (cBlockSize) {
                dctx->stage = bp.lastBlock ? ZSTDds_decompressLastBlock : ZSTDds_decompressBlock;
                return 0;
            }
            /* empty block */
            if (bp.lastBlock) {
                if (dctx->fParams.checksumFlag) {
                    dctx->expected = 4;
                    dctx->stage = ZSTDds_checkChecksum;
                } else {
                    dctx->expected = 0; /* end of frame */
                    dctx->stage = ZSTDds_getFrameHeaderSize;
                }
            } else {
                dctx->expected = ZSTD_blockHeaderSize;  /* jump to next header */
                dctx->stage = ZSTDds_decodeBlockHeader;
            }
            return 0;
        }

    case ZSTDds_decompressLastBlock:
    case ZSTDds_decompressBlock:
        DEBUGLOG(5, "ZSTD_decompressContinue: case ZSTDds_decompressBlock");
        {   size_t rSize;
            switch(dctx->bType)
            {
            case bt_compressed:
                DEBUGLOG(5, "ZSTD_decompressContinue: case bt_compressed");
                rSize = ZSTD_decompressBlock_internal(dctx, dst, dstCapacity, src, srcSize, /* frame */ 1);
                dctx->expected = 0;  /* Streaming not supported */
                break;
            case bt_raw :
                assert(srcSize <= dctx->expected);
                rSize = ZSTD_copyRawBlock(dst, dstCapacity, src, srcSize);
                FORWARD_IF_ERROR(rSize, "ZSTD_copyRawBlock failed");
                assert(rSize == srcSize);
                dctx->expected -= rSize;
                break;
            case bt_rle :
                rSize = ZSTD_setRleBlock(dst, dstCapacity, *(const BYTE*)src, dctx->rleSize);
                dctx->expected = 0;  /* Streaming not supported */
                break;
            case bt_reserved :   /* should never happen */
            default:
                RETURN_ERROR(corruption_detected, "invalid block type");
            }
            FORWARD_IF_ERROR(rSize, "");
            RETURN_ERROR_IF(rSize > dctx->fParams.blockSizeMax, corruption_detected, "Decompressed Block Size Exceeds Maximum");
            DEBUGLOG(5, "ZSTD_decompressContinue: decoded size from block : %u", (unsigned)rSize);
            dctx->decodedSize += rSize;
            if (dctx->validateChecksum) XXH64_update(&dctx->xxhState, dst, rSize);
            dctx->previousDstEnd = (char*)dst + rSize;

            /* Stay on the same stage until we are finished streaming the block. */
            if (dctx->expected > 0) {
                return rSize;
            }

            if (dctx->stage == ZSTDds_decompressLastBlock) {   /* end of frame */
                DEBUGLOG(4, "ZSTD_decompressContinue: decoded size from frame : %u", (unsigned)dctx->decodedSize);
                RETURN_ERROR_IF(
                    dctx->fParams.frameContentSize != ZSTD_CONTENTSIZE_UNKNOWN
                 && dctx->decodedSize != dctx->fParams.frameContentSize,
                    corruption_detected, "");
                if (dctx->fParams.checksumFlag) {  /* another round for frame checksum */
                    dctx->expected = 4;
                    dctx->stage = ZSTDds_checkChecksum;
                } else {
                    ZSTD_DCtx_trace_end(dctx, dctx->decodedSize, dctx->processedCSize, /* streaming */ 1);
                    dctx->expected = 0;   /* ends here */
                    dctx->stage = ZSTDds_getFrameHeaderSize;
                }
            } else {
                dctx->stage = ZSTDds_decodeBlockHeader;
                dctx->expected = ZSTD_blockHeaderSize;
            }
            return rSize;
        }

    case ZSTDds_checkChecksum:
        assert(srcSize == 4);  /* guaranteed by dctx->expected */
        {
            if (dctx->validateChecksum) {
                U32 const h32 = (U32)XXH64_digest(&dctx->xxhState);
                U32 const check32 = MEM_readLE32(src);
                DEBUGLOG(4, "ZSTD_decompressContinue: checksum : calculated %08X :: %08X read", (unsigned)h32, (unsigned)check32);
                RETURN_ERROR_IF(check32 != h32, checksum_wrong, "");
            }
            ZSTD_DCtx_trace_end(dctx, dctx->decodedSize, dctx->processedCSize, /* streaming */ 1);
            dctx->expected = 0;
            dctx->stage = ZSTDds_getFrameHeaderSize;
            return 0;
        }

    case ZSTDds_decodeSkippableHeader:
        assert(src != NULL);
        assert(srcSize <= ZSTD_SKIPPABLEHEADERSIZE);
        ZSTD_memcpy(dctx->headerBuffer + (ZSTD_SKIPPABLEHEADERSIZE - srcSize), src, srcSize);   /* complete skippable header */
        dctx->expected = MEM_readLE32(dctx->headerBuffer + ZSTD_FRAMEIDSIZE);   /* note : dctx->expected can grow seriously large, beyond local buffer size */
        dctx->stage = ZSTDds_skipFrame;
        return 0;

    case ZSTDds_skipFrame:
        dctx->expected = 0;
        dctx->stage = ZSTDds_getFrameHeaderSize;
        return 0;

    default:
        assert(0);   /* impossible */
        RETURN_ERROR(GENERIC, "impossible to reach");   /* some compiler require default to do something */
    }
}